

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> __thiscall
kj::
heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,kj::Own<kj::AsyncInputStream>,kj::Promise<void>>
          (kj *this,Own<kj::AsyncInputStream> *params,Promise<void> *params_1)

{
  DelayedEofInputStream *this_00;
  Own<kj::AsyncInputStream> *other;
  Promise<void> *pPVar1;
  DelayedEofInputStream *extraout_RDX;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> OVar2;
  Promise<void> local_40;
  Own<kj::AsyncInputStream> local_30;
  Promise<void> *local_20;
  Promise<void> *params_local_1;
  Own<kj::AsyncInputStream> *params_local;
  
  local_20 = params_1;
  params_local_1 = (Promise<void> *)params;
  params_local = (Own<kj::AsyncInputStream> *)this;
  this_00 = (DelayedEofInputStream *)operator_new(0x30);
  other = fwd<kj::Own<kj::AsyncInputStream>>
                    ((NoInfer<kj::Own<kj::AsyncInputStream>_> *)params_local_1);
  Own<kj::AsyncInputStream>::Own(&local_30,other);
  pPVar1 = fwd<kj::Promise<void>>(local_20);
  Promise<void>::Promise(&local_40,pPVar1);
  anon_unknown_31::HttpClientAdapter::DelayedEofInputStream::DelayedEofInputStream
            (this_00,&local_30,&local_40);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>::Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> *)this,
             this_00,(Disposer *)
                     &_::
                      HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>
                      ::instance);
  Promise<void>::~Promise(&local_40);
  Own<kj::AsyncInputStream>::~Own(&local_30);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}